

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save_attachment_to_file.c
# Opt level: O0

int main(int argc,char **argv)

{
  CMimeListElem_T *elem;
  CMimePart_T *mp;
  CMimeMessage_T *message;
  char *pcStack_30;
  int i;
  char *out_file;
  char *in_file;
  int retval;
  int option;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  in_file._0_4_ = 0;
  out_file = (char *)0x0;
  pcStack_30 = (char *)0x0;
  message._4_4_ = 0;
  _retval = argv;
  argv_local._0_4_ = argc;
  while (in_file._4_4_ = getopt((int)argv_local,_retval,"hi:o:"), in_file._4_4_ != -1) {
    if (in_file._4_4_ == 0x68) {
      usage();
    }
    else if (in_file._4_4_ == 0x69) {
      asprintf(&out_file,"%s",_optarg);
    }
    else if (in_file._4_4_ == 0x6f) {
      asprintf(&stack0xffffffffffffffd0,"%s",_optarg);
    }
    else {
      usage();
    }
  }
  if ((out_file == (char *)0x0) || (pcStack_30 == (char *)0x0)) {
    printf("you have to specify an input file with -i and an output file with -o\n");
    in_file._0_4_ = -1;
  }
  else {
    mp = (CMimePart_T *)cmime_message_new();
    message._4_4_ = cmime_message_from_file(&mp,out_file,0);
    if (message._4_4_ == 0) {
      cmime_part_to_file(**(undefined8 **)(*(long *)&mp->last + 0x10),pcStack_30);
    }
    else {
      printf("failed opening file [%s]\n",out_file);
      in_file._0_4_ = -1;
    }
    cmime_message_free(mp);
  }
  if (out_file != (char *)0x0) {
    free(out_file);
  }
  if (pcStack_30 != (char *)0x0) {
    free(pcStack_30);
  }
  return (int)in_file;
}

Assistant:

int main(int argc, char *argv[]) {
    int option;
    int retval = 0;
    char *in_file = NULL;
    char *out_file = NULL;
    //int ret;
    int i=0;

    // check command line parameters
    while((option = getopt(argc,argv,"hi:o:")) != EOF) {
        switch(option) {
            case 'i':
                asprintf(&in_file, "%s", optarg);
                break;
            case 'o':
                asprintf(&out_file, "%s", optarg);
                break;  
            case 'h':
                usage();
                break; 
            default:
                usage();
        }
    }

    if(in_file != NULL && out_file != NULL) {

        CMimeMessage_T *message = cmime_message_new();
        CMimePart_T *mp = NULL;
        CMimeListElem_T *elem = NULL;

        i = cmime_message_from_file(&message,in_file,0);
        if(i == 0) {

            /* normally we would go through all the parts like follows */
            /*
            elem = cmime_list_head(message->parts);
            elem = elem->next;
            while(elem != NULL) {
                mp = (CMimePart_T *)cmime_list_data(elem);
                ret = cmime_part_to_file(mp,out_file);
                printf("RET: [%d]\n",ret);
                elem = elem->next;
                break;
            }
            */

            /* for demonstration purpose we just check for the first
               element in the list */
            elem = cmime_list_head(message->parts);
            mp = (CMimePart_T *)cmime_list_data(elem);
            cmime_part_to_file(mp,out_file);

        } else {
            printf("failed opening file [%s]\n", in_file);
            retval = -1;
        }

         // free the initialized object
         cmime_message_free(message);
    } else {
        printf("you have to specify an input file with -i and an output file with -o\n");
        retval = -1;
    }

    if(in_file != NULL)
        free(in_file);
    if(out_file != NULL)
        free(out_file);


    return retval;


}